

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseJsonName
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  string *psVar3;
  Arena *arena;
  ArenaStringPtr *this_00;
  LocationRecorder location;
  LocationRecorder value_location;
  undefined1 local_58 [32];
  LocationRecorder local_38;
  
  if (((field->_has_bits_).has_bits_[0] & 0x10) != 0) {
    local_58._0_8_ = (Parser *)(local_58 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"Already set option \"json_name\".","");
    pEVar1 = this->error_collector_;
    if (pEVar1 != (ErrorCollector *)0x0) {
      (*pEVar1->_vptr_ErrorCollector[2])
                (pEVar1,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,local_58);
    }
    this->had_errors_ = true;
    if ((Parser *)local_58._0_8_ != (Parser *)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_);
    }
    psVar3 = (field->json_name_).ptr_;
    if (psVar3 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      psVar3->_M_string_length = 0;
      *(psVar3->_M_dataplus)._M_p = '\0';
    }
    *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] & 0xef;
  }
  LocationRecorder::Init
            ((LocationRecorder *)local_58,field_location,field_location->source_code_info_);
  LocationRecorder::AddPath((LocationRecorder *)local_58,10);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)local_58,&field->super_Message,OPTION_NAME);
  bVar2 = Consume(this,"json_name");
  if (bVar2) {
    bVar2 = Consume(this,"=");
    if (bVar2) {
      LocationRecorder::Init
                (&local_38,(LocationRecorder *)local_58,(SourceCodeInfo *)local_58._8_8_);
      LocationRecorder::RecordLegacyLocation(&local_38,&field->super_Message,OPTION_VALUE);
      *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] | 0x10;
      arena = (Arena *)(field->_internal_metadata_).
                       super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       .ptr_;
      this_00 = &field->json_name_;
      if (((ulong)arena & 1) != 0) {
        arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
      }
      psVar3 = this_00->ptr_;
      if (psVar3 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_00,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
        psVar3 = this_00->ptr_;
      }
      bVar2 = ConsumeString(this,psVar3,"Expected string for JSON name.");
      LocationRecorder::~LocationRecorder(&local_38);
      goto LAB_00314b80;
    }
  }
  bVar2 = false;
LAB_00314b80:
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_58);
  return bVar2;
}

Assistant:

bool Parser::ParseJsonName(FieldDescriptorProto* field,
                           const LocationRecorder& field_location,
                           const FileDescriptorProto* containing_file) {
  if (field->has_json_name()) {
    AddError("Already set option \"json_name\".");
    field->clear_json_name();
  }

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kJsonNameFieldNumber);
  location.RecordLegacyLocation(field,
                                DescriptorPool::ErrorCollector::OPTION_NAME);

  DO(Consume("json_name"));
  DO(Consume("="));

  LocationRecorder value_location(location);
  value_location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::OPTION_VALUE);

  DO(ConsumeString(field->mutable_json_name(),
                   "Expected string for JSON name."));
  return true;
}